

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O1

void __thiscall
CEException::sofa_exception::sofa_exception
          (sofa_exception *this,string *origin,string *sofa_method,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&bStack_88,"SOFA exception",(allocator *)&local_68);
  CEExceptionHandler::CEExceptionHandler(&this->super_CEExceptionHandler,origin,message,&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_68);
  *(undefined ***)&this->super_CEExceptionHandler = &PTR__CEExceptionHandler_00143928;
  std::operator+(&local_48,"SOFA method: ",sofa_method);
  std::operator+(&local_68,&local_48,"; ");
  std::operator+(&bStack_88,&local_68,message);
  (**(code **)(*(long *)&this->super_CEExceptionHandler + 0x20))(this,&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

CEException::sofa_exception::sofa_exception(const std::string& origin,
                                            const std::string& sofa_method,
                                            const std::string& message) :
    CEExceptionHandler(origin, message, "SOFA exception")
{
    // Overwrite the message
    this->message("SOFA method: " + sofa_method + "; " + message);
}